

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.h
# Opt level: O3

ValVec * __thiscall
dg::llvmdg::InterproceduralNTSCD::getDependencies
          (ValVec *__return_storage_ptr__,InterproceduralNTSCD *this,BasicBlock *b)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  iterator iVar3;
  const_iterator cVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_> ret;
  key_type local_68;
  _Rb_tree<llvm::Value_*,_llvm::Value_*,_std::_Identity<llvm::Value_*>,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
  local_60;
  
  if ((this->super_LLVMControlDependenceAnalysisImpl)._options.
      super_ControlDependenceAnalysisOptions.field_0x3d != '\x01') {
    _compute(this);
    local_60._M_impl._0_8_ = b;
    iVar3 = std::
            _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::CDNode_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::CDNode_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&this->igraphBuilder,(key_type *)&local_60);
    if (((iVar3.super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::CDNode_*>,_false>.
          _M_cur != (__node_type *)0x0) &&
        (uVar2 = *(ulong *)((long)iVar3.
                                  super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::CDNode_*>,_false>
                                  ._M_cur + 0x10), uVar2 != 0)) &&
       (p_Var6 = (this->controlDependence)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
       p_Var6 != (_Base_ptr)0x0)) {
      p_Var1 = &(this->controlDependence)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var6 + 1) >= uVar2) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar2];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(ulong *)(p_Var7 + 1) <= uVar2)) {
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var5 = *(_Rb_tree_node_base **)(p_Var7 + 2);
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var5 != (_Rb_tree_node_base *)&p_Var7[1]._M_left) {
          do {
            local_68 = *(key_type *)(p_Var5 + 1);
            cVar4 = std::
                    _Hashtable<const_dg::CDNode_*,_std::pair<const_dg::CDNode_*const,_const_llvm::Value_*>,_std::allocator<std::pair<const_dg::CDNode_*const,_const_llvm::Value_*>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::CDNode_*>,_std::hash<const_dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&(this->igraphBuilder)._rev_mapping._M_h,&local_68);
            if (cVar4.
                super__Node_iterator_base<std::pair<const_dg::CDNode_*const,_const_llvm::Value_*>,_false>
                ._M_cur == (__node_type *)0x0) {
              local_68 = (key_type)0x0;
            }
            else {
              local_68 = *(key_type *)
                          ((long)cVar4.
                                 super__Node_iterator_base<std::pair<const_dg::CDNode_*const,_const_llvm::Value_*>,_false>
                                 ._M_cur + 0x10);
            }
            std::
            _Rb_tree<llvm::Value*,llvm::Value*,std::_Identity<llvm::Value*>,std::less<llvm::Value*>,std::allocator<llvm::Value*>>
            ::_M_insert_unique<llvm::Value*>
                      ((_Rb_tree<llvm::Value*,llvm::Value*,std::_Identity<llvm::Value*>,std::less<llvm::Value*>,std::allocator<llvm::Value*>>
                        *)&local_60,(Value **)&local_68);
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          } while (p_Var5 != (_Rb_tree_node_base *)&p_Var7[1]._M_left);
        }
        (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
        _M_range_initialize<std::_Rb_tree_const_iterator<llvm::Value*>>
                  ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)__return_storage_ptr__,
                   local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                   &local_60._M_impl.super__Rb_tree_header);
        std::
        _Rb_tree<llvm::Value_*,_llvm::Value_*,_std::_Identity<llvm::Value_*>,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
        ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

ValVec getDependencies(const llvm::BasicBlock *b) override {
        if (getOptions().nodePerInstruction()) {
            return {};
        }

        _compute();

        auto *block = igraphBuilder.getNode(b);
        if (!block) {
            return {};
        }

        assert(_computed && "Did not compute CD");
        auto dit = controlDependence.find(block);
        if (dit == controlDependence.end())
            return {};

        std::set<llvm::Value *> ret;
        for (auto *dep : dit->second) {
            const auto *val = igraphBuilder.getValue(dep);
            assert(val && "Invalid value");
            ret.insert(const_cast<llvm::Value *>(val));
        }

        return ValVec{ret.begin(), ret.end()};
    }